

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

node_t_conflict add_expr(c2m_ctx_t c2m_ctx,int no_err_p)

{
  node_t_conflict pnVar1;
  int no_err_p_local;
  c2m_ctx_t c2m_ctx_local;
  
  pnVar1 = left_op(c2m_ctx,no_err_p,0x106,-1,mul_expr);
  return pnVar1;
}

Assistant:

static expr_t add_expr (gen_ctx_t gen_ctx, MIR_insn_t insn, int replace_p) {
  expr_t e = gen_malloc (gen_ctx, sizeof (struct expr));

  /* can not be calls, rets, stores */
  gen_assert (!MIR_call_code_p (insn->code) && insn->code != MIR_RET && insn->code != MIR_JRET
              && (!move_code_p (insn->code) || insn->ops[0].mode != MIR_OP_VAR_MEM));
  e->insn = insn;
  e->num = ((bb_insn_t) insn->data)->index;
  e->temp_reg = MIR_NON_VAR;
  VARR_PUSH (expr_t, exprs, e);
  if (replace_p)
    replace_expr (gen_ctx, e);
  else
    insert_expr (gen_ctx, e);
  return e;
}